

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void PrepLWall(fixed_t *lwall,double walxrepeat,int x1,int x2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar3 = _DAT_0073b300;
  auVar2 = _DAT_0073b2f0;
  if (x1 < x2) {
    dVar10 = ABS(walxrepeat * 65536.0);
    dVar8 = dVar10 * (double)WallT.UoverZstep;
    dVar9 = (double)WallT.InvZstep;
    lVar4 = (long)x1;
    dVar12 = (double)WallT.InvZorg + dVar9 * (double)(x1 - centerx);
    dVar14 = ((double)WallT.UoverZorg + (double)WallT.UoverZstep * (double)(x1 - centerx)) * dVar10;
    lVar5 = (x2 - lVar4) + -1;
    dVar11 = dVar8 * 0.0 + dVar14;
    dVar14 = dVar8 * 1.0 + dVar14;
    dVar1 = dVar9 * 0.0 + dVar12;
    dVar12 = dVar9 * 1.0 + dVar12;
    auVar13._8_4_ = (int)lVar5;
    auVar13._0_8_ = lVar5;
    auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    uVar7 = -(uint)(walxrepeat < 0.0);
    do {
      auVar15._8_4_ = (int)uVar6;
      auVar15._0_8_ = uVar6;
      auVar15._12_4_ = (int)(uVar6 >> 0x20);
      auVar18 = auVar13 ^ auVar3;
      auVar15 = (auVar15 | auVar2) ^ auVar3;
      auVar16._8_8_ = dVar14;
      auVar16._0_8_ = dVar11;
      auVar17._8_4_ = SUB84(dVar12,0);
      auVar17._0_8_ = dVar1;
      auVar17._12_4_ = (int)((ulong)dVar12 >> 0x20);
      auVar17 = divpd(auVar16,auVar17);
      if ((bool)(~(auVar15._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar15._0_4_ ||
                  auVar18._4_4_ < auVar15._4_4_) & 1)) {
        lwall[lVar4 + uVar6] =
             ~uVar7 & SUB84(auVar17._0_8_ + 6755399441055744.0,0) |
             SUB84((dVar10 + 6755399441055744.0) - auVar17._0_8_,0) & uVar7;
      }
      if ((auVar15._12_4_ != auVar18._12_4_ || auVar15._8_4_ <= auVar18._8_4_) &&
          auVar15._12_4_ <= auVar18._12_4_) {
        lwall[lVar4 + uVar6 + 1] =
             ~uVar7 & SUB84(auVar17._8_8_ + 6755399441055744.0,0) |
             SUB84((dVar10 + 6755399441055744.0) - auVar17._8_8_,0) & uVar7;
      }
      uVar6 = uVar6 + 2;
      dVar11 = dVar11 + dVar8 + dVar8;
      dVar14 = dVar14 + dVar8 + dVar8;
      dVar1 = dVar1 + dVar9 + dVar9;
      dVar12 = dVar12 + dVar9 + dVar9;
    } while (((x2 - lVar4) + 1U & 0xfffffffffffffffe) != uVar6);
  }
  PrepWallRoundFix(lwall,SUB84(walxrepeat + 103079215104.0,0),x1,x2);
  return;
}

Assistant:

void PrepLWall (fixed_t *lwall, double walxrepeat, int x1, int x2)
{ // lwall = texturecolumn
	double top, bot, i;
	double xrepeat = fabs(walxrepeat * 65536);
	double topstep, botstep;

	i = x1 - centerx;
	top = WallT.UoverZorg + WallT.UoverZstep * i;
	bot = WallT.InvZorg + WallT.InvZstep * i;

	top *= xrepeat;
	topstep = WallT.UoverZstep * xrepeat;
	botstep = WallT.InvZstep;

	for (int x = x1; x < x2; x++)
	{
		if (walxrepeat < 0)
		{
			lwall[x] = xs_RoundToInt(xrepeat - top / bot);
		}
		else
		{
			lwall[x] = xs_RoundToInt(top / bot);
		}
		top += topstep;
		bot += botstep;
	}
	PrepWallRoundFix(lwall, FLOAT2FIXED(walxrepeat), x1, x2);
}